

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmTargetExport *name;
  bool bVar1;
  uint uVar2;
  PolicyStatus PVar3;
  MessageLevel message_00;
  const_reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  ulong uVar7;
  long lVar8;
  cmGlobalGenerator *pcVar9;
  cmExportSetMap *this_00;
  cmExportSet *this_01;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_02;
  reference ppcVar10;
  cmTarget *this_03;
  cmInstallExportGenerator *this_04;
  char *destination;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  char *filename_00;
  char *name_space_00;
  static_string_view sVar11;
  bool local_d61;
  cmInstallExportGenerator *exportGenerator;
  undefined1 local_ca0 [4];
  MessageLevel message;
  undefined1 local_c80 [8];
  ostringstream e_5;
  bool newCMP0022Behavior;
  cmTarget *tgt;
  cmTargetExport *te;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range2;
  cmExportSet *exportSet;
  undefined1 local_ab0 [8];
  ostringstream e_4;
  string local_938;
  undefined1 local_918 [8];
  ostringstream e_3;
  string local_798;
  string local_778;
  undefined1 local_758 [8];
  ostringstream e_2;
  undefined1 local_5e0 [8];
  string fname;
  undefined1 local_5a0 [8];
  ostringstream e_1;
  string local_420;
  undefined1 local_400 [8];
  ostringstream e;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_230 [8];
  string filename;
  undefined1 local_208 [7];
  bool exportOld;
  string name_space;
  string exp;
  string local_1b8;
  undefined1 local_198 [8];
  cmInstallCommandArguments ica;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  ica.DefaultComponentName.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&local_1b8,(string *)&this->DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)(name_space.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_208);
  filename.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_230);
  sVar11 = ::cm::operator____s("EXPORT",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_198,sVar11,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&name_space.field_2 + 8));
  sVar11 = ::cm::operator____s("NAMESPACE",9);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_198,sVar11,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  sVar11 = ::cm::operator____s("EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
  cmArgumentParser<void>::Bind<bool>
            ((cmArgumentParser<void> *)local_198,sVar11,
             (bool *)(filename.field_2._M_local_buf + 0xf));
  sVar11 = ::cm::operator____s("FILE",4);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar11.super_string_view._M_len;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_198,sVar11,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_288);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cmArgumentParser<void> *)local_198,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ica.DefaultComponentName.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_400,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given unknown argument \"");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_288,0);
    poVar5 = std::operator<<(poVar5,(string *)pvVar6);
    std::operator<<(poVar5,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
    goto LAB_0031f35e;
  }
  bVar1 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_198);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_0031f35e;
  }
  cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_198);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_5a0,(string *)pvVar4);
    std::operator<<(poVar5," given no DESTINATION!");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)((long)&fname.field_2 + 8));
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    goto LAB_0031f35e;
  }
  std::__cxx11::string::string((string *)local_5e0,(string *)local_230);
  lVar8 = std::__cxx11::string::find_first_of(local_5e0,0x88a929);
  if (lVar8 == -1) {
    uVar2 = std::__cxx11::string::empty();
    local_d61 = false;
    if ((uVar2 & 1) == 0) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_798,(string *)local_5e0);
      local_d61 = std::operator!=(&local_798,".cmake");
      std::__cxx11::string::~string((string *)&local_798);
    }
    if (local_d61 == false) {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)local_5e0,(string *)(name_space.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_5e0,".cmake");
        lVar8 = std::__cxx11::string::find_first_of(local_5e0,0x88a929);
        if (lVar8 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ab0);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)ica.DefaultComponentName.field_2._8_8_,0);
          poVar5 = std::operator<<((ostream *)local_ab0,(string *)pvVar4);
          poVar5 = std::operator<<(poVar5," given export name \"");
          poVar5 = std::operator<<(poVar5,(string *)(name_space.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,"\".  ");
          poVar5 = std::operator<<(poVar5,"This name cannot be safely converted to a file name.  ");
          poVar5 = std::operator<<(poVar5,
                                   "Specify a different export name or use the FILE option to set ")
          ;
          std::operator<<(poVar5,"a file name explicitly.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&exportSet);
          std::__cxx11::string::~string((string *)&exportSet);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ab0);
          goto LAB_0031f342;
        }
      }
      pcVar9 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      this_00 = cmGlobalGenerator::GetExportSets(pcVar9);
      this_01 = cmExportSetMap::operator[](this_00,(string *)((long)&name_space.field_2 + 8));
      if ((filename.field_2._M_local_buf[0xf] & 1U) != 0) {
        this_02 = cmExportSet::GetTargetExports(this_01);
        __end2 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_02);
        te = (cmTargetExport *)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_02);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                                           *)&te), bVar1) {
          ppcVar10 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&__end2);
          name = *ppcVar10;
          pcVar9 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          this_03 = cmGlobalGenerator::FindTarget(pcVar9,&name->TargetName,false);
          bVar1 = false;
          if (this_03 != (cmTarget *)0x0) {
            PVar3 = cmTarget::GetPolicyStatusCMP0022(this_03);
            bVar1 = false;
            if (PVar3 != WARN) {
              PVar3 = cmTarget::GetPolicyStatusCMP0022(this_03);
              bVar1 = PVar3 != OLD;
            }
          }
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c80);
            poVar5 = std::operator<<((ostream *)local_c80,"INSTALL(EXPORT) given keyword \"");
            poVar5 = std::operator<<(poVar5,"EXPORT_LINK_INTERFACE_LIBRARIES");
            poVar5 = std::operator<<(poVar5,"\", but target \"");
            poVar5 = std::operator<<(poVar5,(string *)name);
            std::operator<<(poVar5,"\" does not have policy CMP0022 set to NEW.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_ca0);
            std::__cxx11::string::~string((string *)local_ca0);
            this_local._7_1_ = false;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c80);
            goto LAB_0031f342;
          }
          __gnu_cxx::
          __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
          ::operator++(&__end2);
        }
      }
      message_00 = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
      this_04 = (cmInstallExportGenerator *)operator_new(0x178);
      cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_198);
      destination = (char *)std::__cxx11::string::c_str();
      cmInstallCommandArguments::GetPermissions_abi_cxx11_((cmInstallCommandArguments *)local_198);
      file_permissions = (char *)std::__cxx11::string::c_str();
      configurations =
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                     ((cmInstallCommandArguments *)local_198);
      cmInstallCommandArguments::GetComponent_abi_cxx11_((cmInstallCommandArguments *)local_198);
      component = (char *)std::__cxx11::string::c_str();
      bVar1 = cmInstallCommandArguments::GetExcludeFromAll((cmInstallCommandArguments *)local_198);
      filename_00 = (char *)std::__cxx11::string::c_str();
      name_space_00 = (char *)std::__cxx11::string::c_str();
      cmInstallExportGenerator::cmInstallExportGenerator
                (this_04,this_01,destination,file_permissions,configurations,component,message_00,
                 bVar1,filename_00,name_space_00,(bool)(filename.field_2._M_local_buf[0xf] & 1),
                 false);
      cmMakefile::AddInstallGenerator
                ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_04);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_918);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)ica.DefaultComponentName.field_2._8_8_,0);
      poVar5 = std::operator<<((ostream *)local_918,(string *)pvVar4);
      poVar5 = std::operator<<(poVar5," given invalid export file name \"");
      poVar5 = std::operator<<(poVar5,(string *)local_5e0);
      poVar5 = std::operator<<(poVar5,"\".  ");
      std::operator<<(poVar5,"The FILE argument must specify a name ending in \".cmake\".");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_918);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_758);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_758,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given invalid export file name \"");
    poVar5 = std::operator<<(poVar5,(string *)local_5e0);
    poVar5 = std::operator<<(poVar5,"\".  ");
    poVar5 = std::operator<<(poVar5,"The FILE argument may not contain a path.  ");
    std::operator<<(poVar5,"Specify the path in the DESTINATION argument.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_758);
  }
LAB_0031f342:
  std::__cxx11::string::~string((string *)local_5e0);
LAB_0031f35e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)(name_space.field_2._M_local_buf + 8));
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_198);
  return this_local._7_1_;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;

  ica.Bind("EXPORT"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = exp;
    fname += ".cmake";

    if (fname.find_first_of(":/\\") != std::string::npos) {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
    }
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp];
  if (exportOld) {
    for (cmTargetExport* te : *exportSet->GetTargetExports()) {
      cmTarget* tgt =
        this->Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES"
          << "\", but target \"" << te->TargetName
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.c_str(), exportOld,
    false);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}